

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

Table * sqlite3LocateTableItem(Parse *pParse,u32 flags,SrcList_item *p)

{
  uint uVar1;
  Db *pDVar2;
  Table *pTVar3;
  ulong uVar4;
  Schema **ppSVar5;
  
  if (p->pSchema == (Schema *)0x0) {
    pDVar2 = (Db *)&p->zDatabase;
  }
  else {
    uVar1 = pParse->db->nDb;
    pDVar2 = pParse->db->aDb;
    if ((int)uVar1 < 1) {
      uVar4 = 0;
    }
    else {
      ppSVar5 = &pDVar2->pSchema;
      uVar4 = 0;
      do {
        if (*ppSVar5 == p->pSchema) goto LAB_0015c7ad;
        uVar4 = uVar4 + 1;
        ppSVar5 = ppSVar5 + 4;
      } while (uVar1 != uVar4);
      uVar4 = (ulong)uVar1;
    }
LAB_0015c7ad:
    pDVar2 = pDVar2 + (int)uVar4;
  }
  pTVar3 = sqlite3LocateTable(pParse,flags,p->zName,pDVar2->zDbSName);
  return pTVar3;
}

Assistant:

SQLITE_PRIVATE Table *sqlite3LocateTableItem(
  Parse *pParse, 
  u32 flags,
  struct SrcList_item *p
){
  const char *zDb;
  assert( p->pSchema==0 || p->zDatabase==0 );
  if( p->pSchema ){
    int iDb = sqlite3SchemaToIndex(pParse->db, p->pSchema);
    zDb = pParse->db->aDb[iDb].zDbSName;
  }else{
    zDb = p->zDatabase;
  }
  return sqlite3LocateTable(pParse, flags, p->zName, zDb);
}